

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  CppType CVar1;
  LogMessage *pLVar2;
  MessageLite *pMVar3;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Extension *local_20;
  Extension *extension;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = index;
  extension._4_4_ = number;
  _index_local = this;
  local_20 = FindOrNull(this,number);
  local_59 = 0;
  if (local_20 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x325);
    local_59 = 1;
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: extension != nullptr: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  local_a9 = 0;
  if ((local_20->is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x326);
    local_a9 = 1;
    pLVar2 = LogMessage::operator<<
                       (&local_a8,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=(&local_aa,pLVar2);
  }
  if ((local_a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  CVar1 = anon_unknown_22::cpp_type(local_20->type);
  local_e9 = 0;
  if (CVar1 != CPPTYPE_MESSAGE) {
    LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x326);
    local_e9 = 1;
    pLVar2 = LogMessage::operator<<
                       (&local_e8,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=(&local_ea,pLVar2);
  }
  if ((local_e9 & 1) != 0) {
    LogMessage::~LogMessage(&local_e8);
  }
  pMVar3 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                     ((local_20->field_0).repeated_message_value,(int)extension);
  return pMVar3;
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(int number,
                                                    int index) const {
  const Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->repeated_message_value->Get(index);
}